

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageLoadStoreTests.cpp
# Opt level: O3

VkDescriptorSetLayout __thiscall
vkt::image::anon_unknown_0::ImageLoadStoreTestInstance::prepareDescriptors
          (ImageLoadStoreTestInstance *this)

{
  deInt32 *pdVar1;
  Move<vk::Handle<(vk::HandleType)19>_> *pMVar2;
  uint numDescriptors;
  VkDescriptorSetLayout obj;
  VkDescriptorPool obj_00;
  pointer pSVar3;
  long *plVar4;
  pointer pSVar5;
  SharedPtrStateBase *pSVar6;
  VkImageSubresourceRange subresourceRange;
  VkImageSubresourceRange subresourceRange_00;
  VkImageSubresourceRange subresourceRange_01;
  VkImageSubresourceRange subresourceRange_02;
  Handle<(vk::HandleType)21> HVar7;
  DeviceInterface *pDVar8;
  VkDevice pVVar9;
  VkAllocationCallbacks *pVVar10;
  Handle<(vk::HandleType)19> HVar11;
  ImageType imageType;
  VkImageViewType VVar12;
  VkDevice device;
  DeviceInterface *vk;
  DescriptorSetLayoutBuilder *pDVar13;
  DescriptorPoolBuilder *pDVar14;
  deUint64 *pdVar15;
  long *plVar16;
  int *piVar17;
  Unique<vk::Handle<(vk::HandleType)22>_> *pUVar18;
  SharedPtrStateBase *pSVar19;
  Unique<vk::Handle<(vk::HandleType)13>_> *pUVar20;
  undefined4 uVar21;
  ulong uVar22;
  deInt32 *pdVar23;
  long lVar24;
  Move<vk::Handle<(vk::HandleType)21>_> local_1f8;
  Move<vk::Handle<(vk::HandleType)19>_> local_1d8;
  Move<vk::Handle<(vk::HandleType)22>_> local_1b8;
  Move<vk::Handle<(vk::HandleType)22>_> local_198;
  Move<vk::Handle<(vk::HandleType)13>_> local_178;
  Move<vk::Handle<(vk::HandleType)13>_> local_158;
  Move<vk::Handle<(vk::HandleType)13>_> local_138;
  Move<vk::Handle<(vk::HandleType)13>_> local_118;
  Move<vk::Handle<(vk::HandleType)19>_> *local_f0;
  undefined8 local_e8;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  undefined4 local_d8;
  undefined8 local_d0;
  undefined4 uStack_c8;
  undefined4 uStack_c4;
  undefined4 local_c0;
  DescriptorSetLayoutBuilder local_b8;
  undefined8 local_68;
  undefined8 uStack_60;
  uint local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  uint local_38;
  
  device = Context::getDevice((this->super_LoadStoreTestInstance).super_BaseTestInstance.
                              super_TestInstance.m_context);
  vk = Context::getDeviceInterface
                 ((this->super_LoadStoreTestInstance).super_BaseTestInstance.super_TestInstance.
                  m_context);
  numDescriptors = (this->super_LoadStoreTestInstance).super_BaseTestInstance.m_texture.m_numLayers;
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder(&local_b8);
  pDVar13 = ::vk::DescriptorSetLayoutBuilder::addBinding
                      (&local_b8,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,1,0x20,(VkSampler *)0x0);
  pDVar13 = ::vk::DescriptorSetLayoutBuilder::addBinding
                      (pDVar13,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,1,0x20,(VkSampler *)0x0);
  ::vk::DescriptorSetLayoutBuilder::build(&local_1d8,pDVar13,vk,device,0);
  pVVar10 = local_1d8.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_allocator;
  pVVar9 = local_1d8.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_device;
  pDVar8 = local_1d8.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_deviceIface;
  HVar11.m_internal =
       local_1d8.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal;
  local_1f8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device =
       local_1d8.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_device;
  local_1f8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_allocator =
       local_1d8.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_allocator;
  local_1f8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal =
       local_1d8.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal;
  local_1f8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_deviceIface =
       local_1d8.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_deviceIface;
  local_1d8.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal = 0;
  local_1d8.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_1d8.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_1d8.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  pMVar2 = &this->m_descriptorSetLayout;
  obj.m_internal =
       (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.
       m_internal;
  if (obj.m_internal == 0) {
    (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
    m_device = pVVar9;
    (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
    m_allocator = pVVar10;
    (pMVar2->super_RefBase<vk::Handle<(vk::HandleType)19>_>).m_data.object.m_internal =
         HVar11.m_internal;
    (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
    m_deviceIface = pDVar8;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()
              (&(this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.
                deleter,obj);
    (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
    m_device = local_1f8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device;
    (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
    m_allocator = local_1f8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
                  m_allocator;
    (pMVar2->super_RefBase<vk::Handle<(vk::HandleType)19>_>).m_data.object.m_internal =
         local_1f8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal;
    (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
    m_deviceIface =
         local_1f8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_deviceIface;
    if (local_1d8.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()
                (&local_1d8.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter,
                 (VkDescriptorSetLayout)
                 local_1d8.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal);
    }
  }
  local_1d8.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_1d8.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  local_1d8.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal = 0;
  local_1d8.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  if (local_b8.m_immutableSamplers.
      super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.m_immutableSamplers.
                    super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_b8.m_immutableSamplers.
                          super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.m_immutableSamplers.
                          super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_b8.m_immutableSamplerInfos.
      super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.m_immutableSamplerInfos.
                    super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_b8.m_immutableSamplerInfos.
                          super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.m_immutableSamplerInfos.
                          super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_b8.m_bindings.
      super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.m_bindings.
                    super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_b8.m_bindings.
                          super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.m_bindings.
                          super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)&local_1d8);
  pDVar14 = ::vk::DescriptorPoolBuilder::addType
                      ((DescriptorPoolBuilder *)&local_1d8,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,
                       numDescriptors);
  pDVar14 = ::vk::DescriptorPoolBuilder::addType
                      (pDVar14,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,numDescriptors);
  ::vk::DescriptorPoolBuilder::build(&local_1f8,pDVar14,vk,device,1,numDescriptors);
  pVVar10 = local_1f8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_allocator;
  pVVar9 = local_1f8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device;
  pDVar8 = local_1f8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_deviceIface;
  HVar7.m_internal =
       local_1f8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal;
  local_b8.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)local_1f8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device;
  local_b8.m_immutableSamplerInfos.
  super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)local_1f8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_allocator;
  local_b8.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)local_1f8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal;
  local_b8.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)local_1f8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
                m_deviceIface;
  local_1f8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal = 0;
  local_1f8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_1f8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_1f8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  obj_00.m_internal =
       (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.
       m_internal;
  if (obj_00.m_internal == 0) {
    (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device
         = pVVar9;
    (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
    m_allocator = pVVar10;
    (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal
         = HVar7.m_internal;
    (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
    m_deviceIface = pDVar8;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()
              (&(this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.
                deleter,obj_00);
    (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device
         = (VkDevice)
           local_b8.m_bindings.
           super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
    m_allocator = (VkAllocationCallbacks *)
                  local_b8.m_immutableSamplerInfos.
                  super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal
         = (deUint64)
           local_b8.m_bindings.
           super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
           ._M_impl.super__Vector_impl_data._M_start;
    (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
    m_deviceIface =
         (DeviceInterface *)
         local_b8.m_bindings.
         super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (local_1f8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()
                (&local_1f8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter,
                 (VkDescriptorPool)
                 local_1f8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal);
    }
  }
  local_1f8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_1f8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  local_1f8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal = 0;
  local_1f8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_f0 = pMVar2;
  if ((void *)local_1d8.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal !=
      (void *)0x0) {
    operator_delete((void *)local_1d8.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.
                            m_internal,
                    (long)local_1d8.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
                          m_device -
                    local_1d8.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.
                    m_internal);
  }
  if ((this->super_LoadStoreTestInstance).super_BaseTestInstance.m_singleLayerBind == true) {
    if (0 < (int)numDescriptors) {
      lVar24 = 8;
      uVar22 = 0;
      do {
        imageType = getImageTypeForSingleLayer
                              ((this->super_LoadStoreTestInstance).super_BaseTestInstance.m_texture.
                               m_type);
        VVar12 = mapImageViewType(imageType);
        makeDescriptorSet(&local_198,vk,device,
                          (VkDescriptorPool)
                          (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.
                          m_data.object.m_internal,
                          (VkDescriptorSetLayout)
                          (this->m_descriptorSetLayout).
                          super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal);
        pdVar15 = (deUint64 *)operator_new(0x20);
        pdVar15[2] = (deUint64)
                     local_198.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
                     m_device;
        pdVar15[3] = local_198.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.
                     m_internal;
        *pdVar15 = local_198.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal
        ;
        pdVar15[1] = (deUint64)
                     local_198.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
                     m_deviceIface;
        local_198.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal = 0;
        local_198.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_deviceIface =
             (DeviceInterface *)0x0;
        local_198.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device =
             (VkDevice)0x0;
        local_198.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.m_internal =
             0;
        plVar16 = (long *)operator_new(0x20);
        *(undefined4 *)(plVar16 + 1) = 0;
        *(undefined4 *)((long)plVar16 + 0xc) = 0;
        *plVar16 = (long)&PTR__SharedPtrState_00cef4f0;
        plVar16[2] = (long)pdVar15;
        *(undefined4 *)(plVar16 + 1) = 1;
        *(undefined4 *)((long)plVar16 + 0xc) = 1;
        pSVar3 = (this->m_allDescriptorSets).
                 super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        plVar4 = *(long **)((long)&pSVar3->m_ptr + lVar24);
        if (plVar4 != plVar16) {
          if (plVar4 != (long *)0x0) {
            LOCK();
            plVar4 = plVar4 + 1;
            *(int *)plVar4 = (int)*plVar4 + -1;
            UNLOCK();
            if ((int)*plVar4 == 0) {
              *(undefined8 *)((long)pSVar3 + lVar24 + -8) = 0;
              (**(code **)(**(long **)((long)&pSVar3->m_ptr + lVar24) + 0x10))();
            }
            LOCK();
            piVar17 = (int *)(*(long *)((long)&pSVar3->m_ptr + lVar24) + 0xc);
            *piVar17 = *piVar17 + -1;
            UNLOCK();
            if (*piVar17 == 0) {
              plVar4 = *(long **)((long)&pSVar3->m_ptr + lVar24);
              if (plVar4 != (long *)0x0) {
                (**(code **)(*plVar4 + 8))();
              }
              *(undefined8 *)((long)&pSVar3->m_ptr + lVar24) = 0;
            }
          }
          *(deUint64 **)((long)pSVar3 + lVar24 + -8) = pdVar15;
          *(long **)((long)&pSVar3->m_ptr + lVar24) = plVar16;
          LOCK();
          *(int *)(plVar16 + 1) = (int)plVar16[1] + 1;
          UNLOCK();
          LOCK();
          piVar17 = (int *)(*(long *)((long)&pSVar3->m_ptr + lVar24) + 0xc);
          *piVar17 = *piVar17 + 1;
          UNLOCK();
        }
        plVar4 = plVar16 + 1;
        LOCK();
        *(int *)plVar4 = (int)*plVar4 + -1;
        UNLOCK();
        if ((int)*plVar4 == 0) {
          (**(code **)(*plVar16 + 0x10))(plVar16);
        }
        piVar17 = (int *)((long)plVar16 + 0xc);
        LOCK();
        *piVar17 = *piVar17 + -1;
        UNLOCK();
        if (*piVar17 == 0) {
          (**(code **)(*plVar16 + 8))(plVar16);
        }
        if ((pointer)local_198.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.
                     m_internal != (pointer)0x0) {
          local_b8.m_bindings.
          super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)local_198.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.
                        m_internal;
          (*(local_198.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_deviceIface)
            ->_vptr_DeviceInterface[0x3d])
                    (local_198.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
                     m_deviceIface,
                     local_198.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
                     m_device,local_198.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.
                              deleter.m_pool.m_internal,1,&local_b8);
        }
        local_198.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device =
             (VkDevice)0x0;
        local_198.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.m_internal =
             0;
        local_198.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal = 0;
        local_198.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_deviceIface =
             (DeviceInterface *)0x0;
        local_d0 = 1;
        uStack_c8 = 1;
        uVar21 = (undefined4)uVar22;
        local_c0 = 1;
        subresourceRange.baseArrayLayer = uVar21;
        subresourceRange.levelCount = 1;
        subresourceRange.aspectMask = 1;
        subresourceRange.baseMipLevel = 0;
        subresourceRange.layerCount = 1;
        uStack_c4 = uVar21;
        makeImageView(&local_138,vk,device,
                      (VkImage)(((this->m_imageSrc).
                                 super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>
                                 .m_data.ptr)->m_image).
                               super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                               m_internal,VVar12,
                      (this->super_LoadStoreTestInstance).super_BaseTestInstance.m_format,
                      subresourceRange);
        pdVar15 = (deUint64 *)operator_new(0x20);
        pdVar15[2] = (deUint64)
                     local_138.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
                     m_device;
        pdVar15[3] = (deUint64)
                     local_138.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
                     m_allocator;
        *pdVar15 = local_138.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal
        ;
        pdVar15[1] = (deUint64)
                     local_138.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
                     m_deviceIface;
        local_138.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal = 0;
        local_138.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
             (DeviceInterface *)0x0;
        local_138.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device =
             (VkDevice)0x0;
        local_138.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
             (VkAllocationCallbacks *)0x0;
        plVar16 = (long *)operator_new(0x20);
        *(undefined4 *)(plVar16 + 1) = 0;
        *(undefined4 *)((long)plVar16 + 0xc) = 0;
        *plVar16 = (long)&PTR__SharedPtrState_00cef1b0;
        plVar16[2] = (long)pdVar15;
        *(undefined4 *)(plVar16 + 1) = 1;
        *(undefined4 *)((long)plVar16 + 0xc) = 1;
        pSVar5 = (this->m_allSrcImageViews).
                 super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        plVar4 = *(long **)((long)&pSVar5->m_ptr + lVar24);
        if (plVar4 != plVar16) {
          if (plVar4 != (long *)0x0) {
            LOCK();
            plVar4 = plVar4 + 1;
            *(int *)plVar4 = (int)*plVar4 + -1;
            UNLOCK();
            if ((int)*plVar4 == 0) {
              *(undefined8 *)((long)pSVar5 + lVar24 + -8) = 0;
              (**(code **)(**(long **)((long)&pSVar5->m_ptr + lVar24) + 0x10))();
            }
            LOCK();
            piVar17 = (int *)(*(long *)((long)&pSVar5->m_ptr + lVar24) + 0xc);
            *piVar17 = *piVar17 + -1;
            UNLOCK();
            if (*piVar17 == 0) {
              plVar4 = *(long **)((long)&pSVar5->m_ptr + lVar24);
              if (plVar4 != (long *)0x0) {
                (**(code **)(*plVar4 + 8))();
              }
              *(undefined8 *)((long)&pSVar5->m_ptr + lVar24) = 0;
            }
          }
          *(deUint64 **)((long)pSVar5 + lVar24 + -8) = pdVar15;
          *(long **)((long)&pSVar5->m_ptr + lVar24) = plVar16;
          LOCK();
          *(int *)(plVar16 + 1) = (int)plVar16[1] + 1;
          UNLOCK();
          LOCK();
          piVar17 = (int *)(*(long *)((long)&pSVar5->m_ptr + lVar24) + 0xc);
          *piVar17 = *piVar17 + 1;
          UNLOCK();
        }
        plVar4 = plVar16 + 1;
        LOCK();
        *(int *)plVar4 = (int)*plVar4 + -1;
        UNLOCK();
        if ((int)*plVar4 == 0) {
          (**(code **)(*plVar16 + 0x10))(plVar16);
        }
        piVar17 = (int *)((long)plVar16 + 0xc);
        LOCK();
        *piVar17 = *piVar17 + -1;
        UNLOCK();
        if (*piVar17 == 0) {
          (**(code **)(*plVar16 + 8))(plVar16);
        }
        if (local_138.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal != 0)
        {
          ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
                    (&local_138.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter,
                     (VkImageView)
                     local_138.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.
                     m_internal);
        }
        local_138.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device =
             (VkDevice)0x0;
        local_138.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
             (VkAllocationCallbacks *)0x0;
        local_138.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal = 0;
        local_138.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
             (DeviceInterface *)0x0;
        local_e8 = 1;
        uStack_e0 = 1;
        local_d8 = 1;
        subresourceRange_00.baseArrayLayer = uVar21;
        subresourceRange_00.levelCount = 1;
        subresourceRange_00.aspectMask = 1;
        subresourceRange_00.baseMipLevel = 0;
        subresourceRange_00.layerCount = 1;
        uStack_dc = uVar21;
        makeImageView(&local_158,vk,device,
                      (VkImage)(((this->m_imageDst).
                                 super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>
                                 .m_data.ptr)->m_image).
                               super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                               m_internal,VVar12,
                      (this->super_LoadStoreTestInstance).super_BaseTestInstance.m_format,
                      subresourceRange_00);
        pdVar15 = (deUint64 *)operator_new(0x20);
        pdVar15[2] = (deUint64)
                     local_158.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
                     m_device;
        pdVar15[3] = (deUint64)
                     local_158.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
                     m_allocator;
        *pdVar15 = local_158.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal
        ;
        pdVar15[1] = (deUint64)
                     local_158.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
                     m_deviceIface;
        local_158.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal = 0;
        local_158.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
             (DeviceInterface *)0x0;
        local_158.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device =
             (VkDevice)0x0;
        local_158.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
             (VkAllocationCallbacks *)0x0;
        plVar16 = (long *)operator_new(0x20);
        *(undefined4 *)(plVar16 + 1) = 0;
        *(undefined4 *)((long)plVar16 + 0xc) = 0;
        *plVar16 = (long)&PTR__SharedPtrState_00cef1b0;
        plVar16[2] = (long)pdVar15;
        *(undefined4 *)(plVar16 + 1) = 1;
        *(undefined4 *)((long)plVar16 + 0xc) = 1;
        pSVar5 = (this->m_allDstImageViews).
                 super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        plVar4 = *(long **)((long)&pSVar5->m_ptr + lVar24);
        if (plVar4 != plVar16) {
          if (plVar4 != (long *)0x0) {
            LOCK();
            plVar4 = plVar4 + 1;
            *(int *)plVar4 = (int)*plVar4 + -1;
            UNLOCK();
            if ((int)*plVar4 == 0) {
              *(undefined8 *)((long)pSVar5 + lVar24 + -8) = 0;
              (**(code **)(**(long **)((long)&pSVar5->m_ptr + lVar24) + 0x10))();
            }
            LOCK();
            piVar17 = (int *)(*(long *)((long)&pSVar5->m_ptr + lVar24) + 0xc);
            *piVar17 = *piVar17 + -1;
            UNLOCK();
            if (*piVar17 == 0) {
              plVar4 = *(long **)((long)&pSVar5->m_ptr + lVar24);
              if (plVar4 != (long *)0x0) {
                (**(code **)(*plVar4 + 8))();
              }
              *(undefined8 *)((long)&pSVar5->m_ptr + lVar24) = 0;
            }
          }
          *(deUint64 **)((long)pSVar5 + lVar24 + -8) = pdVar15;
          *(long **)((long)&pSVar5->m_ptr + lVar24) = plVar16;
          LOCK();
          *(int *)(plVar16 + 1) = (int)plVar16[1] + 1;
          UNLOCK();
          LOCK();
          piVar17 = (int *)(*(long *)((long)&pSVar5->m_ptr + lVar24) + 0xc);
          *piVar17 = *piVar17 + 1;
          UNLOCK();
        }
        plVar4 = plVar16 + 1;
        LOCK();
        *(int *)plVar4 = (int)*plVar4 + -1;
        UNLOCK();
        if ((int)*plVar4 == 0) {
          (**(code **)(*plVar16 + 0x10))(plVar16);
        }
        piVar17 = (int *)((long)plVar16 + 0xc);
        LOCK();
        *piVar17 = *piVar17 + -1;
        UNLOCK();
        if (*piVar17 == 0) {
          (**(code **)(*plVar16 + 8))(plVar16);
        }
        if (local_158.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal != 0)
        {
          ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
                    (&local_158.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter,
                     (VkImageView)
                     local_158.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.
                     m_internal);
        }
        local_158.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device =
             (VkDevice)0x0;
        local_158.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
             (VkAllocationCallbacks *)0x0;
        local_158.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal = 0;
        local_158.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
             (DeviceInterface *)0x0;
        uVar22 = uVar22 + 1;
        lVar24 = lVar24 + 0x10;
      } while (numDescriptors != uVar22);
    }
  }
  else {
    VVar12 = mapImageViewType((this->super_LoadStoreTestInstance).super_BaseTestInstance.m_texture.
                              m_type);
    makeDescriptorSet(&local_1b8,vk,device,
                      (VkDescriptorPool)
                      (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data
                      .object.m_internal,
                      (VkDescriptorSetLayout)
                      (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.
                      m_data.object.m_internal);
    pUVar18 = (Unique<vk::Handle<(vk::HandleType)22>_> *)operator_new(0x20);
    (pUVar18->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.deleter.m_device =
         local_1b8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device;
    (pUVar18->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.deleter.m_pool.m_internal =
         local_1b8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.m_internal;
    *(deUint64 *)&(pUVar18->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data =
         local_1b8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal;
    (pUVar18->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.deleter.m_deviceIface =
         local_1b8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_deviceIface;
    local_1b8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal = 0;
    local_1b8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)0x0;
    local_1b8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device = (VkDevice)0x0
    ;
    local_1b8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.m_internal = 0;
    pSVar19 = (SharedPtrStateBase *)operator_new(0x20);
    pdVar1 = &pSVar19->strongRefCount;
    pSVar19->strongRefCount = 0;
    pSVar19->weakRefCount = 0;
    pSVar19->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00cef4f0;
    pSVar19[1]._vptr_SharedPtrStateBase = (_func_int **)pUVar18;
    pSVar19->strongRefCount = 1;
    pSVar19->weakRefCount = 1;
    pSVar3 = (this->m_allDescriptorSets).
             super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pSVar6 = pSVar3->m_state;
    if (pSVar6 != pSVar19) {
      if (pSVar6 != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar23 = &pSVar6->strongRefCount;
        *pdVar23 = *pdVar23 + -1;
        UNLOCK();
        if (*pdVar23 == 0) {
          pSVar3->m_ptr = (Unique<vk::Handle<(vk::HandleType)22>_> *)0x0;
          (*pSVar3->m_state->_vptr_SharedPtrStateBase[2])();
        }
        LOCK();
        pdVar23 = &pSVar3->m_state->weakRefCount;
        *pdVar23 = *pdVar23 + -1;
        UNLOCK();
        if (*pdVar23 == 0) {
          if (pSVar3->m_state != (SharedPtrStateBase *)0x0) {
            (*pSVar3->m_state->_vptr_SharedPtrStateBase[1])();
          }
          pSVar3->m_state = (SharedPtrStateBase *)0x0;
        }
      }
      pSVar3->m_ptr = pUVar18;
      pSVar3->m_state = pSVar19;
      LOCK();
      pSVar19->strongRefCount = pSVar19->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar23 = &pSVar3->m_state->weakRefCount;
      *pdVar23 = *pdVar23 + 1;
      UNLOCK();
    }
    pdVar23 = &pSVar19->weakRefCount;
    LOCK();
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      (*pSVar19->_vptr_SharedPtrStateBase[2])(pSVar19);
    }
    LOCK();
    *pdVar23 = *pdVar23 + -1;
    UNLOCK();
    if (*pdVar23 == 0) {
      (*pSVar19->_vptr_SharedPtrStateBase[1])(pSVar19);
    }
    if ((pointer)local_1b8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal
        != (pointer)0x0) {
      local_b8.m_bindings.
      super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)local_1b8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.
                    m_internal;
      (*(local_1b8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_deviceIface)->
        _vptr_DeviceInterface[0x3d])
                (local_1b8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
                 m_deviceIface,
                 local_1b8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device,
                 local_1b8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.
                 m_internal,1);
    }
    local_1b8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device = (VkDevice)0x0
    ;
    local_1b8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.m_internal = 0;
    local_1b8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal = 0;
    local_1b8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)0x0;
    local_48 = 1;
    uStack_40 = 1;
    subresourceRange_01.levelCount = 1;
    subresourceRange_01.baseArrayLayer = 0;
    subresourceRange_01.aspectMask = 1;
    subresourceRange_01.baseMipLevel = 0;
    subresourceRange_01.layerCount = numDescriptors;
    local_38 = numDescriptors;
    makeImageView(&local_178,vk,device,
                  (VkImage)(((this->m_imageSrc).
                             super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>
                             .m_data.ptr)->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.
                           m_data.object.m_internal,VVar12,
                  (this->super_LoadStoreTestInstance).super_BaseTestInstance.m_format,
                  subresourceRange_01);
    pUVar20 = (Unique<vk::Handle<(vk::HandleType)13>_> *)operator_new(0x20);
    (pUVar20->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.deleter.m_device =
         local_178.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device;
    (pUVar20->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.deleter.m_allocator =
         local_178.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator;
    *(deUint64 *)&(pUVar20->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data =
         local_178.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal;
    (pUVar20->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.deleter.m_deviceIface =
         local_178.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface;
    local_178.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal = 0;
    local_178.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)0x0;
    local_178.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device = (VkDevice)0x0
    ;
    local_178.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)0x0;
    pSVar19 = (SharedPtrStateBase *)operator_new(0x20);
    pdVar1 = &pSVar19->strongRefCount;
    pSVar19->strongRefCount = 0;
    pSVar19->weakRefCount = 0;
    pSVar19->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00cef1b0;
    pSVar19[1]._vptr_SharedPtrStateBase = (_func_int **)pUVar20;
    pSVar19->strongRefCount = 1;
    pSVar19->weakRefCount = 1;
    pSVar5 = (this->m_allSrcImageViews).
             super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pSVar6 = pSVar5->m_state;
    if (pSVar6 != pSVar19) {
      if (pSVar6 != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar23 = &pSVar6->strongRefCount;
        *pdVar23 = *pdVar23 + -1;
        UNLOCK();
        if (*pdVar23 == 0) {
          pSVar5->m_ptr = (Unique<vk::Handle<(vk::HandleType)13>_> *)0x0;
          (*pSVar5->m_state->_vptr_SharedPtrStateBase[2])();
        }
        LOCK();
        pdVar23 = &pSVar5->m_state->weakRefCount;
        *pdVar23 = *pdVar23 + -1;
        UNLOCK();
        if (*pdVar23 == 0) {
          if (pSVar5->m_state != (SharedPtrStateBase *)0x0) {
            (*pSVar5->m_state->_vptr_SharedPtrStateBase[1])();
          }
          pSVar5->m_state = (SharedPtrStateBase *)0x0;
        }
      }
      pSVar5->m_ptr = pUVar20;
      pSVar5->m_state = pSVar19;
      LOCK();
      pSVar19->strongRefCount = pSVar19->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar23 = &pSVar5->m_state->weakRefCount;
      *pdVar23 = *pdVar23 + 1;
      UNLOCK();
    }
    pdVar23 = &pSVar19->weakRefCount;
    LOCK();
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      (*pSVar19->_vptr_SharedPtrStateBase[2])(pSVar19);
    }
    LOCK();
    *pdVar23 = *pdVar23 + -1;
    UNLOCK();
    if (*pdVar23 == 0) {
      (*pSVar19->_vptr_SharedPtrStateBase[1])(pSVar19);
    }
    if (local_178.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
                (&local_178.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter,
                 (VkImageView)
                 local_178.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal);
    }
    local_178.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device = (VkDevice)0x0
    ;
    local_178.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)0x0;
    local_178.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal = 0;
    local_178.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)0x0;
    local_68 = 1;
    uStack_60 = 1;
    subresourceRange_02.levelCount = 1;
    subresourceRange_02.baseArrayLayer = 0;
    subresourceRange_02.aspectMask = 1;
    subresourceRange_02.baseMipLevel = 0;
    subresourceRange_02.layerCount = numDescriptors;
    local_58 = numDescriptors;
    makeImageView(&local_118,vk,device,
                  (VkImage)(((this->m_imageDst).
                             super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>
                             .m_data.ptr)->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.
                           m_data.object.m_internal,VVar12,
                  (this->super_LoadStoreTestInstance).super_BaseTestInstance.m_format,
                  subresourceRange_02);
    pUVar20 = (Unique<vk::Handle<(vk::HandleType)13>_> *)operator_new(0x20);
    (pUVar20->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.deleter.m_device =
         local_118.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device;
    (pUVar20->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.deleter.m_allocator =
         local_118.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator;
    *(deUint64 *)&(pUVar20->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data =
         local_118.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal;
    (pUVar20->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.deleter.m_deviceIface =
         local_118.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface;
    local_118.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal = 0;
    local_118.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)0x0;
    local_118.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device = (VkDevice)0x0
    ;
    local_118.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)0x0;
    pSVar19 = (SharedPtrStateBase *)operator_new(0x20);
    pdVar1 = &pSVar19->strongRefCount;
    pSVar19->strongRefCount = 0;
    pSVar19->weakRefCount = 0;
    pSVar19->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00cef1b0;
    pSVar19[1]._vptr_SharedPtrStateBase = (_func_int **)pUVar20;
    pSVar19->strongRefCount = 1;
    pSVar19->weakRefCount = 1;
    pSVar5 = (this->m_allDstImageViews).
             super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pSVar6 = pSVar5->m_state;
    if (pSVar6 != pSVar19) {
      if (pSVar6 != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar23 = &pSVar6->strongRefCount;
        *pdVar23 = *pdVar23 + -1;
        UNLOCK();
        if (*pdVar23 == 0) {
          pSVar5->m_ptr = (Unique<vk::Handle<(vk::HandleType)13>_> *)0x0;
          (*pSVar5->m_state->_vptr_SharedPtrStateBase[2])();
        }
        LOCK();
        pdVar23 = &pSVar5->m_state->weakRefCount;
        *pdVar23 = *pdVar23 + -1;
        UNLOCK();
        if (*pdVar23 == 0) {
          if (pSVar5->m_state != (SharedPtrStateBase *)0x0) {
            (*pSVar5->m_state->_vptr_SharedPtrStateBase[1])();
          }
          pSVar5->m_state = (SharedPtrStateBase *)0x0;
        }
      }
      pSVar5->m_ptr = pUVar20;
      pSVar5->m_state = pSVar19;
      LOCK();
      pSVar19->strongRefCount = pSVar19->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar23 = &pSVar5->m_state->weakRefCount;
      *pdVar23 = *pdVar23 + 1;
      UNLOCK();
    }
    pdVar23 = &pSVar19->weakRefCount;
    LOCK();
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      (*pSVar19->_vptr_SharedPtrStateBase[2])(pSVar19);
    }
    LOCK();
    *pdVar23 = *pdVar23 + -1;
    UNLOCK();
    if (*pdVar23 == 0) {
      (*pSVar19->_vptr_SharedPtrStateBase[1])(pSVar19);
    }
    if (local_118.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
                (&local_118.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter,
                 (VkImageView)
                 local_118.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal);
    }
  }
  return (VkDescriptorSetLayout)
         (local_f0->super_RefBase<vk::Handle<(vk::HandleType)19>_>).m_data.object.m_internal;
}

Assistant:

VkDescriptorSetLayout ImageLoadStoreTestInstance::prepareDescriptors (void)
{
	const VkDevice			device	= m_context.getDevice();
	const DeviceInterface&	vk		= m_context.getDeviceInterface();

	const int numLayers = m_texture.numLayers();
	m_descriptorSetLayout = DescriptorSetLayoutBuilder()
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, VK_SHADER_STAGE_COMPUTE_BIT)
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, VK_SHADER_STAGE_COMPUTE_BIT)
		.build(vk, device);

	m_descriptorPool = DescriptorPoolBuilder()
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, numLayers)
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, numLayers)
		.build(vk, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, numLayers);

	if (m_singleLayerBind)
	{
		for (int layerNdx = 0; layerNdx < numLayers; ++layerNdx)
		{
			const VkImageViewType viewType = mapImageViewType(getImageTypeForSingleLayer(m_texture.type()));
			const VkImageSubresourceRange subresourceRange = makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, layerNdx, 1u);

			m_allDescriptorSets[layerNdx] = makeVkSharedPtr(makeDescriptorSet(vk, device, *m_descriptorPool, *m_descriptorSetLayout));
			m_allSrcImageViews[layerNdx]  = makeVkSharedPtr(makeImageView(vk, device, m_imageSrc->get(), viewType, m_format, subresourceRange));
			m_allDstImageViews[layerNdx]  = makeVkSharedPtr(makeImageView(vk, device, m_imageDst->get(), viewType, m_format, subresourceRange));
		}
	}
	else // bind all layers at once
	{
		const VkImageViewType viewType = mapImageViewType(m_texture.type());
		const VkImageSubresourceRange subresourceRange = makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, numLayers);

		m_allDescriptorSets[0] = makeVkSharedPtr(makeDescriptorSet(vk, device, *m_descriptorPool, *m_descriptorSetLayout));
		m_allSrcImageViews[0]  = makeVkSharedPtr(makeImageView(vk, device, m_imageSrc->get(), viewType, m_format, subresourceRange));
		m_allDstImageViews[0]  = makeVkSharedPtr(makeImageView(vk, device, m_imageDst->get(), viewType, m_format, subresourceRange));
	}

	return *m_descriptorSetLayout;  // not passing the ownership
}